

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_source.cpp
# Opt level: O2

ItemSource * ItemSource::from_json(Json *json,World *world,bool resolve_map_entities)

{
  pointer pbVar1;
  bool bVar2;
  uchar uVar3;
  byte entity_id;
  unsigned_short map_id;
  uint address_in_rom;
  const_reference pvVar4;
  ItemSourceOnGround *this;
  Map *this_00;
  LandstalkerException *pLVar5;
  ostream *poVar6;
  JsonParsingException *this_01;
  _Vector_base<Entity_*,_std::allocator<Entity_*>_> *this_02;
  pointer this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hints;
  vector<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  entity_jsons;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  vector<Entity_*,_std::allocator<Entity_*>_> entities;
  Entity *entity;
  string local_2a8;
  string local_288;
  stringstream msg;
  ostream local_258 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Vector_base<Entity_*,_std::allocator<Entity_*>_> local_60;
  _Vector_base<Entity_*,_std::allocator<Entity_*>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msg,"name",(allocator<char> *)&local_2f8);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)&msg);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_288,pvVar4);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msg,"type",(allocator<char> *)&local_2a8);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)&msg);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_2f8,pvVar4);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msg,"nodeId",(allocator<char> *)&local_358);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)&msg);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_2a8,pvVar4);
  std::__cxx11::string::~string((string *)&msg);
  hints.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  hints.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  hints.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[6],_0>(json,(char (*) [6])"hints");
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"hints",(allocator<char> *)&local_358);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)&msg);
    nlohmann::detail::
    from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (pvVar4,&hints);
    std::__cxx11::string::~string((string *)&msg);
  }
  bVar2 = std::operator==(&local_2f8,"chest");
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"chestId",(allocator<char> *)&local_358);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)&msg);
    uVar3 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<unsigned_char,_0>(pvVar4);
    std::__cxx11::string::~string((string *)&msg);
    this = (ItemSourceOnGround *)operator_new(0x70);
    ItemSourceChest::ItemSourceChest((ItemSourceChest *)this,uVar3,&local_288,&local_2a8,&hints);
  }
  else {
    bVar2 = std::operator==(&local_2f8,"ground");
    if (!bVar2) {
      bVar2 = std::operator==(&local_2f8,"shop");
      if (!bVar2) {
        bVar2 = std::operator==(&local_2f8,"reward");
        if (!bVar2) {
          std::__cxx11::stringstream::stringstream((stringstream *)&msg);
          poVar6 = std::operator<<(local_258,"Invalid item source type name \'");
          poVar6 = std::operator<<(poVar6,(string *)&local_2f8);
          std::operator<<(poVar6,"\' found in JSON.");
          this_01 = (JsonParsingException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          JsonParsingException::JsonParsingException(this_01,&local_358);
          __cxa_throw(this_01,&JsonParsingException::typeinfo,
                      LandstalkerException::~LandstalkerException);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"address",(allocator<char> *)&local_358);
        pvVar4 = nlohmann::
                 basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::at(json,(key_type *)&msg);
        address_in_rom =
             nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::get_impl<unsigned_int,_0>(pvVar4);
        std::__cxx11::string::~string((string *)&msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"rewardId",(allocator<char> *)&local_358);
        pvVar4 = nlohmann::
                 basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::at(json,(key_type *)&msg);
        uVar3 = nlohmann::
                basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<unsigned_char,_0>(pvVar4);
        std::__cxx11::string::~string((string *)&msg);
        this = (ItemSourceOnGround *)operator_new(0x70);
        ItemSourceReward::ItemSourceReward
                  ((ItemSourceReward *)this,address_in_rom,&local_288,uVar3,&local_2a8,&hints);
        goto LAB_001225e6;
      }
    }
    entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    if (resolve_map_entities) {
      entity_jsons.
      super__Vector_base<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      entity_jsons.
      super__Vector_base<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      entity_jsons.
      super__Vector_base<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = nlohmann::
              basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::contains<const_char_(&)[9],_0>(json,(char (*) [9])0x1ea1c6);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"entities",(allocator<char> *)&local_358);
        pvVar4 = nlohmann::
                 basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::at(json,(key_type *)&msg);
        nlohmann::detail::
        from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_0>
                  (pvVar4,&entity_jsons);
      }
      else {
        bVar2 = nlohmann::
                basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::contains<const_char_(&)[7],_0>(json,(char (*) [7])0x1ea36b);
        if (!bVar2) {
          pLVar5 = (LandstalkerException *)__cxa_allocate_exception(0x28);
          std::operator+(&local_358,"No entity information was provided for ground item source \'",
                         &local_288);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                         &local_358,"\'");
          LandstalkerException::LandstalkerException(pLVar5,(string *)&msg);
          __cxa_throw(pLVar5,&LandstalkerException::typeinfo,
                      LandstalkerException::~LandstalkerException);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"entity",(allocator<char> *)&local_e0);
        pvVar4 = nlohmann::
                 basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::at(json,(key_type *)&msg);
        nlohmann::
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&local_358,pvVar4);
        std::
        vector<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_assign_aux<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const*>
                  ((vector<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&entity_jsons,&local_358,&local_358.field_2);
        nlohmann::
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&local_358);
      }
      std::__cxx11::string::~string((string *)&msg);
      pbVar1 = entity_jsons.
               super__Vector_base<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_03 = entity_jsons.
                     super__Vector_base<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_03 != pbVar1;
          this_03 = this_03 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"mapId",(allocator<char> *)&local_358);
        pvVar4 = nlohmann::
                 basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::at(this_03,(key_type *)&msg);
        map_id = nlohmann::
                 basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get_impl<unsigned_short,_0>(pvVar4);
        std::__cxx11::string::~string((string *)&msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"entityId",(allocator<char> *)&local_358);
        pvVar4 = nlohmann::
                 basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::at(this_03,(key_type *)&msg);
        entity_id = nlohmann::
                    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::get_impl<unsigned_char,_0>(pvVar4);
        std::__cxx11::string::~string((string *)&msg);
        this_00 = World::map(world,map_id);
        entity = Map::entity(this_00,entity_id);
        if ((entity->_attrs).type_id < 0xc0) {
          pLVar5 = (LandstalkerException *)__cxa_allocate_exception(0x28);
          std::__cxx11::to_string(&local_a0,(uint)entity_id);
          std::operator+(&local_80,"EntityType ",&local_a0);
          std::operator+(&local_e0,&local_80," of map ");
          std::__cxx11::to_string(&local_c0,(uint)map_id);
          std::operator+(&local_358,&local_e0,&local_c0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                         &local_358," is not a ground item.");
          LandstalkerException::LandstalkerException(pLVar5,(string *)&msg);
          __cxa_throw(pLVar5,&LandstalkerException::typeinfo,
                      LandstalkerException::~LandstalkerException);
        }
        std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*&>
                  ((vector<Entity*,std::allocator<Entity*>> *)&entities,&entity);
      }
      std::
      vector<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~vector(&entity_jsons);
    }
    bVar2 = std::operator==(&local_2f8,"shop");
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,"shopItemId",(allocator<char> *)&local_358);
      pvVar4 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(json,(key_type *)&msg);
      uVar3 = nlohmann::
              basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<unsigned_char,_0>(pvVar4);
      std::__cxx11::string::~string((string *)&msg);
      this = (ItemSourceOnGround *)operator_new(0x88);
      this_02 = &local_48;
      std::vector<Entity_*,_std::allocator<Entity_*>_>::vector
                ((vector<Entity_*,_std::allocator<Entity_*>_> *)this_02,&entities);
      ItemSourceShop::ItemSourceShop
                ((ItemSourceShop *)this,&local_288,
                 (vector<Entity_*,_std::allocator<Entity_*>_> *)this_02,uVar3,&local_2a8,&hints);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,"groundItemId",(allocator<char> *)&local_358);
      pvVar4 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(json,(key_type *)&msg);
      uVar3 = nlohmann::
              basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<unsigned_char,_0>(pvVar4);
      std::__cxx11::string::~string((string *)&msg);
      this = (ItemSourceOnGround *)operator_new(0x88);
      this_02 = &local_60;
      std::vector<Entity_*,_std::allocator<Entity_*>_>::vector
                ((vector<Entity_*,_std::allocator<Entity_*>_> *)this_02,&entities);
      ItemSourceOnGround::ItemSourceOnGround
                (this,&local_288,(vector<Entity_*,_std::allocator<Entity_*>_> *)this_02,uVar3,
                 &local_2a8,&hints,true);
    }
    std::_Vector_base<Entity_*,_std::allocator<Entity_*>_>::~_Vector_base(this_02);
    std::_Vector_base<Entity_*,_std::allocator<Entity_*>_>::~_Vector_base
              (&entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>);
  }
LAB_001225e6:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&hints);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_288);
  return &this->super_ItemSource;
}

Assistant:

ItemSource* ItemSource::from_json(const Json& json, const World& world, bool resolve_map_entities)
{
    const std::string& name = json.at("name");
    const std::string& type = json.at("type");
    const std::string& node_id = json.at("nodeId");

    std::vector<std::string> hints;
    if(json.contains("hints")) 
        json.at("hints").get_to(hints);

    if(type == "chest")
    {
        uint8_t chest_id = json.at("chestId");
        return new ItemSourceChest(chest_id, name, node_id, hints);
    }
    else if(type == "ground" || type == "shop")
    {
        std::vector<Entity*> entities;

        if(resolve_map_entities)
        {
            std::vector<Json> entity_jsons;
            if(json.contains("entities"))
                json.at("entities").get_to(entity_jsons);
            else if(json.contains("entity"))
                entity_jsons = { json.at("entity") };
            else
                throw LandstalkerException("No entity information was provided for ground item source '" + name + "'");

            for(const Json& entity_json : entity_jsons)
            {
                uint16_t map_id = entity_json.at("mapId");
                uint8_t entity_id = entity_json.at("entityId");
                Entity* entity = world.map(map_id)->entity(entity_id);
                if(entity->entity_type_id() < 0xC0) // 0xC0 is the first ground item ID
                    throw LandstalkerException("EntityType " + std::to_string(entity_id) + " of map " + std::to_string(map_id) + " is not a ground item.");

                entities.emplace_back(entity);
            }
        }

        if(type == "shop")
        {
            uint8_t shop_item_id = json.at("shopItemId");
            return new ItemSourceShop(name, entities, shop_item_id, node_id, hints);
        }
        else
        {
            uint8_t ground_item_id = json.at("groundItemId");
            return new ItemSourceOnGround(name, entities, ground_item_id, node_id, hints);
        }
    }
    else if(type == "reward")
    {
        uint32_t address_in_rom = json.at("address");
        uint8_t reward_id = json.at("rewardId");
        return new ItemSourceReward(address_in_rom, name, reward_id, node_id, hints);
    }

    std::stringstream msg;
    msg << "Invalid item source type name '" << type << "' found in JSON.";
    throw JsonParsingException(msg.str());
}